

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestinitiatorFixtureDisconnect_ResetOnDisconnect::
~TestinitiatorFixtureDisconnect_ResetOnDisconnect
          (TestinitiatorFixtureDisconnect_ResetOnDisconnect *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, Disconnect_ResetOnDisconnect) {
  startLoggedOn();

  object->setResetOnDisconnect(true);

  object->setNextSenderMsgSeqNum(20);
  object->setNextTargetMsgSeqNum(20);

  object->disconnect();

  CHECK_EQUAL(1, object->getExpectedSenderNum());
  CHECK_EQUAL(1, object->getExpectedTargetNum());

}